

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t utf8_string_length(utf8_char_t *data,utf8_size_t size)

{
  size_t sVar1;
  uint uVar2;
  
  if (size == 0) {
    size = utf8_char_count(data,0);
  }
  if (data == (utf8_char_t *)0x0 || size == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      if (*data == 0) {
        return sVar1;
      }
      uVar2 = (uint)((byte)*data >> 3);
      if ((0x80ff0000U >> uVar2 & 1) != 0) {
        return sVar1;
      }
      data = (utf8_char_t *)((byte *)data + utf8_char_length::_utf8_char_length[uVar2]);
      sVar1 = sVar1 + utf8_char_length::_utf8_char_length[uVar2];
      size = size - 1;
    } while (size != 0);
  }
  return sVar1;
}

Assistant:

size_t utf8_string_length(const utf8_char_t* data, utf8_size_t size)
{
    size_t char_length, byts = 0;

    if (0 == size) {
        size = utf8_char_count(data, 0);
    }

    for (; 0 < size; --size) {
        if (0 == (char_length = utf8_char_length(data))) {
            break;
        }

        data += char_length;
        byts += char_length;
    }

    return byts;
}